

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char ** stb_getopt_param(int *argc,char **argv,char *param)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  char **ppcVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  int iVar8;
  char **opts_00;
  int local_6c;
  char **opts;
  char **local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  opts = (char **)0x0;
  ppcVar4 = (char **)0x0;
  opts_00 = (char **)0x0;
  iVar5 = 1;
  local_6c = 1;
  local_58 = argv;
  local_38 = param;
  do {
    iVar8 = *argc;
    if (iVar8 <= local_6c) goto LAB_00150f03;
    lVar3 = (long)local_6c;
    pcVar7 = argv[lVar3];
    if (*pcVar7 == '-') {
      cVar6 = pcVar7[1];
      if (cVar6 == '\0') {
        ppcVar4 = local_58 + iVar5;
        while (lVar3 = lVar3 + 1, lVar3 < iVar8) {
          *ppcVar4 = local_58[lVar3];
          iVar5 = iVar5 + 1;
          ppcVar4 = ppcVar4 + 1;
        }
LAB_00150f03:
        if ((opts == (char **)0x0) || (*(int *)((long)opts + -0xc) <= *(int *)(opts + -2))) {
          stb__arr_addlen_(&opts,8,1);
        }
        else {
          *(int *)(opts + -2) = *(int *)(opts + -2) + 1;
        }
        opts[(long)*(int *)(opts + -2) + -1] = (char *)0x0;
        *argc = iVar5;
        return opts;
      }
      local_40 = pcVar7 + 1;
      lVar3 = 1;
      local_4c = iVar5;
      local_48 = pcVar7;
      while (iVar8 = (int)lVar3, argv = local_58, iVar5 = local_4c, cVar6 != '\0') {
        pcVar1 = strchr(local_38,(int)cVar6);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = (char *)malloc(2);
          if (pcVar1 == (char *)0x0) {
            return (char **)0x0;
          }
          *pcVar1 = cVar6;
          pcVar1[1] = '\0';
        }
        else {
          if (local_40[iVar8] == '\0') {
            if (local_6c == *argc + -1) {
              *argc = 0;
              stb_getopt_free(opts_00);
              return (char **)0x0;
            }
            lVar3 = (long)local_6c;
            local_6c = local_6c + 1;
            pcVar7 = local_58[lVar3 + 1];
          }
          else {
            pcVar7 = local_40 + iVar8;
            sVar2 = strlen(pcVar7);
            iVar8 = iVar8 + (int)sVar2;
          }
          sVar2 = strlen(pcVar7);
          pcVar1 = (char *)malloc((long)((int)sVar2 + 2));
          if (pcVar1 == (char *)0x0) {
            return (char **)0x0;
          }
          *pcVar1 = cVar6;
          strcpy(pcVar1 + 1,pcVar7);
          pcVar7 = local_48;
        }
        if ((opts_00 == (char **)0x0) || (*(int *)((long)opts_00 + -0xc) <= *(int *)(opts_00 + -2)))
        {
          stb__arr_addlen_(&opts,8,1);
          ppcVar4 = opts;
        }
        else {
          *(int *)(opts_00 + -2) = *(int *)(opts_00 + -2) + 1;
        }
        if (ppcVar4 == (char **)0x0) {
          lVar3 = 0;
        }
        else {
          lVar3 = (long)*(int *)(ppcVar4 + -2);
        }
        ppcVar4[lVar3 + -1] = pcVar1;
        lVar3 = (long)iVar8 + 1;
        opts_00 = ppcVar4;
        cVar6 = pcVar7[(long)iVar8 + 1];
      }
    }
    else {
      argv[iVar5] = pcVar7;
      iVar5 = iVar5 + 1;
    }
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

char **stb_getopt_param(int *argc, char **argv, char *param)
{
   char ** opts=NULL;
   int i,j=1;
   for (i=1; i < *argc; ++i) {
      if (argv[i][0] != '-') {
         argv[j++] = argv[i];
      } else {
         if (argv[i][1] == 0) { // plain - == don't parse further options
            ++i;
            while (i < *argc)
               argv[j++] = argv[i++];
            break;
         } else {
            int k;
            char *q = argv[i];  // traverse options list
            for (k=1; q[k]; ++k) {
               char *s;
               if (strchr(param, q[k])) {  // does it take a parameter?
                  char *t = &q[k+1], z = q[k];
                  int len=0;
                  if (*t == 0) {
                     if (i == *argc-1) { // takes a parameter, but none found
                        *argc = 0;
                        stb_getopt_free(opts);
                        return NULL;
                     }
                     t = argv[++i];
                  } else
                     k += strlen(t);
                  len = strlen(t);
                  s = (char *) malloc(len+2);
                  if (!s) return NULL;
                  s[0] = z;
                  strcpy(s+1, t);
               } else {
                  // no parameter
                  s = (char *) malloc(2);
                  if (!s) return NULL;
                  s[0] = q[k];
                  s[1] = 0;
               }
               stb_arr_push(opts, s);
            }
         }
      }
   }
   stb_arr_push(opts, NULL);
   *argc = j;
   return opts;
}